

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

void __thiscall slack::_detail::Slacking::checkResponse(Slacking *this,string *method,Json *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  string_t reason;
  string_t local_48;
  
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[3]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)json,(char (*) [3])"ok");
  if (sVar3 != 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)json,"ok");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_48,pvVar4,-1,' ',false,strict);
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    paVar1 = &local_48.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<< ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(method->_M_dataplus)._M_p,method->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," [passed]\n",10);
    }
    else {
      sVar3 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)json,(char (*) [6])0x128da4);
      if (sVar3 == 0) {
        local_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"checkResponse() unknown error.","");
        trigger_error(this,&local_48);
      }
      else {
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"error");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::dump(&local_48,pvVar4,-1,' ',false,strict);
        trigger_error(this,&local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"<< checkResponse() error details: ",0x22);
        poVar5 = nlohmann::operator<<((ostream *)&std::cerr,json);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void checkResponse(const std::string& method, const Json& json) {
        ignore_unused_parameter(method);
        if (json.count("ok")) {
            if(json["ok"].dump() == "true") {
#if SLACKING_VERBOSE_OUTPUT
                std::cout << "<< " << method << " [passed]\n";
#endif
            }
            else {
                if (json.count("error")) {
                    auto reason = json["error"].dump();
                    trigger_error(reason);
#if SLACKING_VERBOSE_OUTPUT
                    std::cerr << "<< checkResponse() error details: " << json << std::endl;
#endif
                }
                else {
                    trigger_error("checkResponse() unknown error.");
                }
            }
        }
    }